

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

int bandit::run(options *opt,spec_registry *specs,contextstack_t *context_stack,listener *listener)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  bandit_context *local_a0;
  undefined1 local_98 [8];
  bandit_context global_context;
  bool hard_skip;
  anon_class_1_0_00000001 call_func;
  listener *listener_local;
  contextstack_t *context_stack_local;
  spec_registry *specs_local;
  options *opt_local;
  
  bVar1 = detail::options::help(opt);
  if (bVar1) {
    detail::options::print_usage(opt);
    opt_local._4_4_ = 0;
  }
  else {
    bVar1 = detail::options::version(opt);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"bandit version ");
      poVar3 = std::operator<<(poVar3,"2.0.0");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      opt_local._4_4_ = 0;
    }
    else {
      (*listener->_vptr_listener[2])();
      global_context.after_eaches_.
      super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      _M_node._M_size._6_1_ = 0;
      detail::bandit_context::bandit_context((bandit_context *)local_98,"",false);
      local_a0 = (bandit_context *)local_98;
      std::deque<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>::push_back
                (context_stack,(value_type *)&local_a0);
      cVar4 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
              begin(specs);
      cVar5 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
              end(specs);
      std::
      for_each<std::_List_const_iterator<std::function<void()>>,bandit::run(bandit::detail::options_const&,std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>const&,std::deque<bandit::detail::context*,std::allocator<bandit::detail::context*>>&,bandit::detail::listener&)::_lambda(std::function<void()>const&)_1_>
                (cVar4._M_node,cVar5._M_node);
      (*listener->_vptr_listener[3])();
      uVar2 = (*listener->_vptr_listener[0xc])();
      opt_local._4_4_ = (uint)((uVar2 & 1) == 0);
      detail::bandit_context::~bandit_context((bandit_context *)local_98);
    }
  }
  return opt_local._4_4_;
}

Assistant:

inline int run(const detail::options& opt, const detail::spec_registry& specs,
      detail::contextstack_t& context_stack, detail::listener& listener)
  {
    if(opt.help())
    {
      opt.print_usage();
      return 0;
    }

    if(opt.version())
    {
      std::cout << "bandit version " << BANDIT_VERSION << std::endl;
      return 0;
    }

    auto call_func = [](const detail::voidfunc_t& func) {
      func();
    };

    listener.test_run_starting();

    bool hard_skip = false;
    detail::bandit_context global_context("", hard_skip);
    context_stack.push_back(&global_context);

    for_each(specs.begin(), specs.end(), call_func);

    listener.test_run_complete();

    return listener.did_we_pass() ? 0 : 1;
  }